

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O3

int __thiscall
cmCPackDebGenerator::PackageOnePack
          (cmCPackDebGenerator *this,string *initialTopLevel,string *packageName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmCPackLog *this_00;
  size_t msg;
  bool bVar3;
  string *psVar4;
  long *plVar5;
  size_t length;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  size_type *psVar7;
  uint uVar8;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string component_path;
  string outputFileName;
  string localToplevel;
  string packageFileName;
  ostringstream cmCPackLog_msg;
  basic_string_view<char,_std::char_traits<char>_> local_248;
  size_type local_238;
  pointer local_230;
  string local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  long *local_1e8 [2];
  long local_1d8 [2];
  string local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_1e8[0] = local_1d8;
  pcVar2 = (initialTopLevel->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e8,pcVar2,pcVar2 + initialTopLevel->_M_string_length);
  cmsys::SystemTools::GetParentDirectory(&local_1c8,&(this->super_cmCPackGenerator).toplevel);
  paVar1 = &local_228.field_2;
  local_228._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"CPACK_PACKAGE_FILE_NAME","")
  ;
  psVar4 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_228);
  if (psVar4 == (string *)0x0) {
    psVar4 = &cmValue::Empty_abi_cxx11_;
  }
  pcVar2 = (psVar4->_M_dataplus)._M_p;
  local_248._M_len = (size_t)&local_238;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,pcVar2,pcVar2 + psVar4->_M_string_length);
  std::__cxx11::string::append((char *)&local_248);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_248,(ulong)(packageName->_M_dataplus)._M_p);
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar6) {
    local_198[0]._0_8_ = paVar6->_M_allocated_capacity;
    local_198[0]._8_4_ = (undefined4)plVar5[3];
    local_198[0]._12_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
    local_1a8._0_8_ = local_198;
  }
  else {
    local_198[0]._0_8_ = paVar6->_M_allocated_capacity;
    local_1a8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar5;
  }
  local_1a8._8_8_ = plVar5[1];
  *plVar5 = (long)paVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[4])(this);
  plVar5 = (long *)std::__cxx11::string::append(local_1a8);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_208.field_2._M_allocated_capacity = *psVar7;
    local_208.field_2._8_8_ = plVar5[3];
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  }
  else {
    local_208.field_2._M_allocated_capacity = *psVar7;
    local_208._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_208._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
  }
  if ((size_type *)local_248._M_len != &local_238) {
    operator_delete((void *)local_248._M_len,local_238 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,"/",
                 packageName);
  std::__cxx11::string::_M_append((char *)local_1e8,local_1a8._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
  }
  local_1a8._0_8_ = local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_TEMPORARY_DIRECTORY","");
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,(string *)local_1a8,(string *)local_1e8)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,"/",
                 &local_208);
  std::__cxx11::string::_M_append((char *)&local_1c8,local_1a8._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
  }
  local_1a8._0_8_ = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CPACK_OUTPUT_FILE_NAME","");
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,(string *)local_1a8,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
  }
  local_1a8._0_8_ = local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_TEMPORARY_PACKAGE_FILE_NAME","");
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,(string *)local_1a8,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
  }
  local_1a8._0_8_ = local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_DEB_PACKAGE_COMPONENT","");
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)local_1a8,(cmValue)packageName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
  }
  local_1a8._0_8_ = (pointer)0x1;
  local_198[0]._0_1_ = 0x2f;
  local_230 = (packageName->_M_dataplus)._M_p;
  local_238 = packageName->_M_string_length;
  local_248._M_len = 1;
  views._M_len = 2;
  views._M_array = &local_248;
  local_248._M_str = (char *)local_198;
  local_1a8._8_8_ = local_198;
  cmCatViews_abi_cxx11_(&local_228,views);
  local_1a8._0_8_ = local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_DEB_PACKAGE_COMPONENT_PART_PATH","");
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,(string *)local_1a8,&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
  }
  bVar3 = cmCPackGenerator::ReadListFile
                    (&this->super_cmCPackGenerator,"Internal/CPack/CPackDeb.cmake");
  if (bVar3) {
    bVar3 = createDebPackages(this);
    uVar8 = (uint)bVar3;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Error while execution CPackDeb.cmake",0x24);
    std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8._0_8_ + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    this_00 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    msg = local_248._M_len;
    length = strlen((char *)local_248._M_len);
    cmCPackLog::Log(this_00,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x231,(char *)msg,length);
    if ((size_type *)local_248._M_len != &local_238) {
      operator_delete((void *)local_248._M_len,local_238 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar8 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  return uVar8;
}

Assistant:

int cmCPackDebGenerator::PackageOnePack(std::string const& initialTopLevel,
                                        std::string const& packageName)
{
  // Begin the archive for this pack
  std::string localToplevel(initialTopLevel);
  std::string packageFileName(
    cmSystemTools::GetParentDirectory(this->toplevel));
  std::string outputFileName(*this->GetOption("CPACK_PACKAGE_FILE_NAME") +
                             "-" + packageName + this->GetOutputExtension());

  localToplevel += "/" + packageName;
  /* replace the TEMP DIRECTORY with the component one */
  this->SetOption("CPACK_TEMPORARY_DIRECTORY", localToplevel);
  packageFileName += "/" + outputFileName;
  /* replace proposed CPACK_OUTPUT_FILE_NAME */
  this->SetOption("CPACK_OUTPUT_FILE_NAME", outputFileName);
  /* replace the TEMPORARY package file name */
  this->SetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME", packageFileName);
  // Tell CPackDeb.cmake the name of the component GROUP.
  this->SetOption("CPACK_DEB_PACKAGE_COMPONENT", packageName);
  // Tell CPackDeb.cmake the path where the component is.
  std::string component_path = cmStrCat('/', packageName);
  this->SetOption("CPACK_DEB_PACKAGE_COMPONENT_PART_PATH", component_path);
  if (!this->ReadListFile("Internal/CPack/CPackDeb.cmake")) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Error while execution CPackDeb.cmake" << std::endl);
    return 0;
  }

  return this->createDebPackages();
}